

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O2

bool __thiscall CNscContext::ParsePragmaNscIntrinsics(CNscContext *this,char *pszPragma)

{
  char cVar1;
  
  do {
    cVar1 = *pszPragma;
    if (cVar1 == '\0') {
      if (this->m_fNWScript != false) {
        this->m_fCompilingIntrinsic = true;
        return true;
      }
      GenerateMessage(this,NscMessage_ErrorNscIntrinsicsIsInternalOnly);
      return false;
    }
    pszPragma = pszPragma + 1;
  } while ((byte)(cVar1 + 0x81U) < 0xa2);
  GenerateMessage(this,NscMessage_ErrorPreprocessorSyntax,"#pragma");
  return false;
}

Assistant:

bool CNscContext::ParsePragmaNscIntrinsics (const char *pszPragma)
{
	const char *p = pszPragma;

	//
	// Make sure there isn't anything at the end
	//

	while (*p && (*p <= ' ' || *p > 126))
		p++;
	if (*p != 0)
	{
		GenerateMessage (NscMessage_ErrorPreprocessorSyntax, "#pragma");
		return false;
	}

	if (IsNWScript () == false)
	{
		GenerateMessage (NscMessage_ErrorNscIntrinsicsIsInternalOnly);
		return false;
	}

	SetCompilingIntrinsic (true);
	return true;
}